

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowConstantAggregator::Evaluate
          (WindowConstantAggregator *this,WindowAggregatorState *gsink,WindowAggregatorState *lstate
          ,DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  WindowConstantAggregatorGlobalState *pWVar1;
  type target;
  SelectionVector *sel_p;
  WindowConstantAggregatorLocalState *source_count;
  const_reference pvVar2;
  SelectionVector *in_R9;
  unsigned_long begin;
  idx_t i;
  idx_t target_offset;
  idx_t matched;
  WindowConstantAggregatorLocalState *lcstate;
  unsigned_long *begins;
  Vector *results;
  vector<unsigned_long,_true> *partition_offsets;
  WindowConstantAggregatorGlobalState *gasink;
  size_type in_stack_ffffffffffffff88;
  sel_t *__n;
  WindowAggregatorState *in_stack_ffffffffffffff90;
  SelectionVector *this_00;
  idx_t target_offset_00;
  SelectionVector *this_01;
  Vector *source_p;
  
  pWVar1 = WindowAggregatorState::Cast<duckdb::WindowConstantAggregatorGlobalState>
                     (in_stack_ffffffffffffff90);
  source_p = (Vector *)&pWVar1->partition_offsets;
  target = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                      in_stack_ffffffffffffff90);
  vector<duckdb::Vector,_true>::operator[]
            ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sel_p = (SelectionVector *)FlatVector::GetData<unsigned_long_const>((Vector *)0x1a37a86);
  source_count = WindowAggregatorState::Cast<duckdb::WindowConstantAggregatorLocalState>
                           (in_stack_ffffffffffffff90);
  this_01 = (SelectionVector *)0x0;
  target_offset_00 = 0;
  for (this_00 = (SelectionVector *)0x0; this_00 < in_R9;
      this_00 = (SelectionVector *)((long)&this_00->sel_vector + 1)) {
    __n = (&sel_p->sel_vector)[(long)this_00];
    while (pvVar2 = vector<unsigned_long,_true>::operator[]
                              ((vector<unsigned_long,_true> *)this_00,(size_type)__n),
          (sel_t *)*pvVar2 <= __n) {
      if (this_01 != (SelectionVector *)0x0) {
        VectorOperations::Copy
                  (source_p,target,sel_p,(idx_t)source_count,(idx_t)this_01,target_offset_00);
        target_offset_00 = (long)&this_01->sel_vector + target_offset_00;
        this_01 = (SelectionVector *)0x0;
      }
      source_count->partition = source_count->partition + 1;
    }
    this_01 = (SelectionVector *)((long)&this_01->sel_vector + 1);
    SelectionVector::set_index(this_01,target_offset_00,(idx_t)this_00);
  }
  if (this_01 != (SelectionVector *)0x0) {
    if ((target_offset_00 == 0) && (this_01 == in_R9)) {
      VectorOperations::Copy(source_p,target,sel_p,(idx_t)source_count,(idx_t)this_01,0);
      Vector::SetVectorType(source_p,(VectorType)((ulong)target >> 0x38));
    }
    else {
      VectorOperations::Copy
                (source_p,target,sel_p,(idx_t)source_count,(idx_t)this_01,target_offset_00);
    }
  }
  return;
}

Assistant:

void WindowConstantAggregator::Evaluate(const WindowAggregatorState &gsink, WindowAggregatorState &lstate,
                                        const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gasink = gsink.Cast<WindowConstantAggregatorGlobalState>();
	const auto &partition_offsets = gasink.partition_offsets;
	const auto &results = *gasink.results;

	auto begins = FlatVector::GetData<const idx_t>(bounds.data[FRAME_BEGIN]);
	//	Chunk up the constants and copy them one at a time
	auto &lcstate = lstate.Cast<WindowConstantAggregatorLocalState>();
	idx_t matched = 0;
	idx_t target_offset = 0;
	for (idx_t i = 0; i < count; ++i) {
		const auto begin = begins[i];
		//	Find the partition containing [begin, end)
		while (partition_offsets[lcstate.partition + 1] <= begin) {
			//	Flush the previous partition's data
			if (matched) {
				VectorOperations::Copy(results, result, lcstate.matches, matched, 0, target_offset);
				target_offset += matched;
				matched = 0;
			}
			++lcstate.partition;
		}

		lcstate.matches.set_index(matched++, lcstate.partition);
	}

	//	Flush the last partition
	if (matched) {
		// Optimize constant result
		if (target_offset == 0 && matched == count) {
			VectorOperations::Copy(results, result, lcstate.matches, 1, 0, target_offset);
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		} else {
			VectorOperations::Copy(results, result, lcstate.matches, matched, 0, target_offset);
		}
	}
}